

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O3

void json_add_int(json_t *json,char *key,int64_t value)

{
  int iVar1;
  size_t len;
  undefined1 in_R8B;
  char buffer [512];
  char acStack_228 [520];
  
  json_check_comma(json);
  iVar1 = snprintf(acStack_228,0x200,"%ld");
  if (key != (char *)0x0) {
    len = strlen(key);
    json_write_raw(json,key,len,true,(_Bool)in_R8B);
    json_write_raw(json,":",1,false,(_Bool)in_R8B);
  }
  json_write_raw(json,acStack_228,(long)iVar1,false,(_Bool)in_R8B);
  return;
}

Assistant:

void json_add_int (json_t *json, const char *key, int64_t value) {
    json_check_comma(json);
    
    char buffer[512];
    size_t len = snprintf(buffer, sizeof(buffer), "%" PRId64, value);

    if (key) {
        json_write_raw (json, key, strlen(key), true, true);
        JSON_WRITE_COLUMN;
    }
    
    json_write_raw(json, buffer, len, false, (key == NULL));
}